

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uchar *puVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_t sVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint *bitlen;
  HuffmanTree *bitlen_00;
  byte bVar17;
  HuffmanTree *pHVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint *puVar22;
  int iVar23;
  ulong __n;
  long lVar24;
  ulong uVar25;
  uint *puVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 in_ZMM6 [64];
  HuffmanTree tree_ll;
  LodePNGBitReader local_178;
  HuffmanTree *local_150;
  uint local_144;
  HuffmanTree *local_140;
  HuffmanTree *local_138;
  ulong local_130;
  HuffmanTree *local_128;
  uint local_120;
  uint local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  long local_108;
  ucvector *local_100;
  unsigned_short *local_f8;
  LodePNGDecompressSettings *local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d0 [16];
  undefined1 local_b8 [16];
  undefined1 local_a0 [24];
  undefined1 local_88 [16];
  undefined1 local_70 [24];
  undefined1 local_58 [32];
  
  local_178.bitsize = insize * 8;
  uVar14 = 0x69;
  if (local_178.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_178.bp = 0;
    local_178.buffer = 0;
    local_118 = 0x8000000000000000;
    uStack_110 = 0x8000000000000000;
    local_58._8_8_ = 0x8000000000000000;
    local_58._0_8_ = 0x8000000000000000;
    local_58._16_8_ = 0x8000000000000000;
    local_58._24_8_ = 0x8000000000000000;
    uVar19 = 0;
    local_178.data = in;
    local_178.size = insize;
    local_f0 = settings;
    do {
      if (uVar19 != 0) {
        return 0;
      }
      in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
      uVar14 = ensureBits9(&local_178,3);
      sVar13 = local_178.size;
      puVar1 = local_178.data;
      if (uVar14 == 0) {
        return 0x34;
      }
      uVar19 = local_178.buffer >> 3;
      uVar21 = local_178.bp + 3;
      uVar14 = local_178.buffer >> 1 & 3;
      local_11c = local_178.buffer;
      local_178.buffer = uVar19;
      if (uVar14 == 0) {
        uVar20 = local_178.bp + 10 >> 3;
        uVar25 = uVar20 + 4;
        if (local_178.size <= uVar25) {
          return 0x34;
        }
        uVar2 = *(ushort *)(local_178.data + uVar20);
        __n = (ulong)uVar2;
        if ((local_f0->ignore_nlen == 0) &&
           ((uint)*(ushort *)(local_178.data + uVar20 + 2) + (uint)uVar2 != 0xffff)) {
          return 0x15;
        }
        local_178.bp = uVar21;
        uVar14 = ucvector_resize(out,out->size + __n);
        if (uVar14 == 0) {
          return 0x53;
        }
        if (sVar13 < uVar25 + __n) {
          return 0x17;
        }
        if (uVar2 != 0) {
          memcpy(out->data + (out->size - __n),puVar1 + uVar25,__n);
        }
        local_178.bp = (uVar25 + __n) * 8;
        uVar14 = 0;
      }
      else {
        if (uVar14 == 3) {
          return 0x14;
        }
        local_b8 = (undefined1  [16])0x0;
        local_a0._0_16_ = (undefined1  [16])0x0;
        local_e8 = (undefined1  [16])0x0;
        local_d0 = (undefined1  [16])0x0;
        if (uVar14 == 1) {
          local_178.bp = uVar21;
          uVar14 = generateFixedLitLenTree((HuffmanTree *)local_b8);
          if (uVar14 == 0) {
            uVar14 = generateFixedDistanceTree((HuffmanTree *)local_e8);
            goto LAB_00125f4f;
          }
        }
        else {
          local_178.bp = uVar21;
          uVar19 = ensureBits17(&local_178,0xe);
          uVar14 = local_178.buffer;
          if (uVar19 == 0) {
            uVar14 = 0x31;
          }
          else {
            local_178.buffer = local_178.buffer >> 0xe;
            uVar21 = local_178.bp + 0xe;
            local_178.bp = uVar21;
            bitlen = (uint *)malloc(0x4c);
            if (bitlen == (uint *)0x0) {
              uVar14 = 0x53;
            }
            else {
              uVar19 = uVar14 >> 10 & 0xf;
              local_150 = (HuffmanTree *)((ulong)uVar19 + 4);
              local_88 = (undefined1  [16])0x0;
              local_70._0_16_ = (undefined1  [16])0x0;
              uVar25 = (long)local_150 * 3 + uVar21;
              if ((uVar25 < uVar21) || (local_178.bitsize < uVar25)) {
                bitlen_00 = (HuffmanTree *)0x0;
                local_150 = (HuffmanTree *)0x0;
                uVar14 = 0x32;
              }
              else {
                local_130 = (ulong)(uVar14 & 0x1f);
                local_138 = (HuffmanTree *)(local_130 + 0x101);
                local_140 = (HuffmanTree *)(ulong)((uVar14 >> 5 & 0x1f) + 1);
                uVar21 = (ulong)(uVar19 << 2);
                lVar24 = 0;
                local_128 = (HuffmanTree *)(ulong)(uVar14 >> 10);
                local_100 = out;
                do {
                  ensureBits9(&local_178,3);
                  out = local_100;
                  uVar14 = local_178.buffer & 7;
                  local_178.buffer = local_178.buffer >> 3;
                  uVar25 = local_178.bp + 3;
                  bitlen[*(uint *)((long)CLCL_ORDER + lVar24)] = uVar14;
                  lVar24 = lVar24 + 4;
                  local_178.bp = uVar25;
                } while (uVar21 + 0x10 != lVar24);
                auVar3 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
                if ((int)local_150 != 0x13) {
                  uVar14 = ~(uint)local_128 & 0xf;
                  lVar24 = (ulong)uVar14 - 1;
                  auVar31._8_8_ = lVar24;
                  auVar31._0_8_ = lVar24;
                  auVar30._16_8_ = lVar24;
                  auVar30._0_16_ = auVar31;
                  auVar30._24_8_ = lVar24;
                  auVar9._8_8_ = uStack_110;
                  auVar9._0_8_ = local_118;
                  auVar5 = auVar31 ^ auVar9;
                  uVar20 = 0;
                  do {
                    auVar32._8_8_ = uVar20;
                    auVar32._0_8_ = uVar20;
                    auVar32._16_8_ = uVar20;
                    auVar32._24_8_ = uVar20;
                    auVar7 = vpor_avx2(auVar32,_DAT_001e3c60);
                    auVar4._8_8_ = uStack_110;
                    auVar4._0_8_ = local_118;
                    auVar4 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar4,auVar5);
                    auVar4 = vpackssdw_avx(auVar4,auVar4);
                    auVar4 = vpackssdw_avx(auVar4 ^ auVar3,auVar4 ^ auVar3);
                    if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      bitlen[*(uint *)(uVar21 + 0x1e5050 + uVar20 * 4)] = 0;
                    }
                    auVar10._8_8_ = uStack_110;
                    auVar10._0_8_ = local_118;
                    auVar4 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar10,auVar5);
                    auVar4 = vpackssdw_avx(auVar4,auVar4);
                    auVar4 = vpackssdw_avx(auVar4 ^ auVar3,auVar4 ^ auVar3);
                    if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      bitlen[*(uint *)(uVar21 + 0x1e5054 + uVar20 * 4)] = 0;
                    }
                    auVar6 = vpcmpgtq_avx2(auVar7 ^ local_58,auVar30 ^ local_58);
                    auVar29 = ZEXT1632(auVar5);
                    auVar7 = vpackssdw_avx2(auVar6,auVar29);
                    auVar4 = auVar7._16_16_ ^ auVar3;
                    auVar4 = vpackssdw_avx(auVar4,auVar4);
                    if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      bitlen[*(uint *)(uVar21 + 0x1e5058 + uVar20 * 4)] = 0;
                    }
                    auVar7 = vpackssdw_avx2(auVar6,auVar29);
                    auVar4 = auVar7._16_16_ ^ auVar3;
                    auVar4 = vpackssdw_avx(auVar4,auVar4);
                    if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      bitlen[*(uint *)(uVar21 + 0x1e505c + uVar20 * 4)] = 0;
                    }
                    auVar7 = vpor_avx2(auVar32,_DAT_001e3fa0);
                    auVar11._8_8_ = uStack_110;
                    auVar11._0_8_ = local_118;
                    auVar4 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar11,auVar31 ^ auVar9);
                    auVar4 = vpackssdw_avx(auVar4,auVar4);
                    auVar4 = vpackssdw_avx(auVar4 ^ auVar3,auVar4 ^ auVar3);
                    if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      bitlen[*(uint *)(uVar21 + 0x1e5060 + uVar20 * 4)] = 0;
                    }
                    auVar12._8_8_ = uStack_110;
                    auVar12._0_8_ = local_118;
                    auVar4 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar12,auVar31 ^ auVar9);
                    auVar4 = vpackssdw_avx(auVar4,auVar4);
                    auVar4 = vpackssdw_avx(auVar4 ^ auVar3,auVar4 ^ auVar3);
                    if ((auVar4 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      bitlen[*(uint *)(uVar21 + 0x1e5064 + uVar20 * 4)] = 0;
                    }
                    auVar32 = vpcmpgtq_avx2(auVar7 ^ local_58,auVar30 ^ local_58);
                    auVar7 = vpackssdw_avx2(auVar29,auVar32);
                    auVar4 = auVar7._16_16_ ^ auVar3;
                    auVar4 = vpackssdw_avx(auVar4,auVar4);
                    if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      bitlen[*(uint *)(uVar21 + 0x1e5068 + uVar20 * 4)] = 0;
                    }
                    auVar7 = vpshufhw_avx2(auVar32,0x84);
                    auVar4 = auVar7._16_16_ ^ auVar3;
                    auVar4 = vpackssdw_avx(auVar4,auVar4);
                    if ((auVar4 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      bitlen[*(uint *)(uVar21 + 0x1e506c + uVar20 * 4)] = 0;
                    }
                    uVar20 = uVar20 + 8;
                  } while ((uVar14 + 7 & 0xfffffff8) != uVar20);
                }
                in_ZMM6 = ZEXT1664(auVar3);
                uVar14 = HuffmanTree_makeFromLengths((HuffmanTree *)local_88,bitlen,0x13,7);
                if (uVar14 == 0) {
                  bitlen_00 = (HuffmanTree *)malloc(0x480);
                  local_150 = (HuffmanTree *)malloc(0x80);
                  if (local_150 == (HuffmanTree *)0x0 || bitlen_00 == (HuffmanTree *)0x0) {
                    uVar14 = 0x53;
                  }
                  else {
                    uVar19 = 0;
                    memset(bitlen_00,0,0x480);
                    auVar30 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                    local_150->codes = (uint *)auVar30._0_8_;
                    local_150->lengths = (uint *)auVar30._8_8_;
                    local_150->maxbitlen = auVar30._16_4_;
                    local_150->numcodes = auVar30._20_4_;
                    local_150->table_len = (uchar *)auVar30._24_8_;
                    *(undefined1 (*) [32])&local_150->table_value = auVar30;
                    *(undefined1 (*) [32])&local_150[1].table_len = auVar30;
                    *(undefined1 (*) [32])&local_150[2].maxbitlen = auVar30;
                    local_140 = (HuffmanTree *)(ulong)(uint)((int)local_140 + (int)local_138);
                    local_128 = (HuffmanTree *)local_70._0_8_;
                    local_f8 = (unsigned_short *)local_70._8_8_;
                    local_120 = (int)local_130 + 0x102;
                    uVar14 = -(int)local_130;
                    local_130 = (ulong)uVar14;
                    local_108 = (long)(int)uVar14 + -0x101;
                    local_144 = 0;
                    do {
                      uVar21 = uVar25 >> 3;
                      if (uVar21 + 3 < local_178.size) {
                        local_178.buffer = *(uint *)(local_178.data + uVar21);
                      }
                      else {
                        local_178.buffer = 0;
                        if (uVar21 < local_178.size) {
                          local_178.buffer = (uint)local_178.data[uVar21];
                        }
                        if (uVar21 + 1 < local_178.size) {
                          local_178.buffer =
                               local_178.buffer | (uint)local_178.data[uVar21 + 1] << 8;
                        }
                        if (uVar21 + 2 < local_178.size) {
                          local_178.buffer =
                               local_178.buffer | (uint)local_178.data[uVar21 + 2] << 0x10;
                        }
                      }
                      local_178.buffer = local_178.buffer >> ((byte)uVar25 & 7);
                      in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
                      uVar14 = huffmanDecodeSymbol(&local_178,local_128);
                      if (uVar14 < 0x10) {
                        uVar15 = (uint)local_138;
                        pHVar18 = local_150;
                        if (uVar19 < uVar15) {
                          uVar15 = 0;
                          pHVar18 = bitlen_00;
                        }
                        *(uint *)((long)&pHVar18->codes + (ulong)(uVar19 - uVar15) * 4) = uVar14;
                        uVar19 = uVar19 + 1;
                      }
                      else {
                        iVar8 = (int)local_108;
                        if (uVar14 == 0x12) {
                          uVar14 = local_178.buffer & 0x7f;
                          local_178.buffer = local_178.buffer >> 7;
                          local_178.bp = local_178.bp + 7;
                          pHVar18 = (HuffmanTree *)(ulong)uVar19;
                          iVar23 = -uVar19;
                          puVar22 = (uint *)((long)&bitlen_00->codes + (long)pHVar18 * 4);
                          iVar16 = uVar14 + 0xb;
                          do {
                            if (local_140 <= pHVar18) {
                              uVar19 = -iVar23;
                              local_144 = 0xf;
                              goto LAB_0012658f;
                            }
                            puVar26 = (uint *)((long)&local_150->codes +
                                              (ulong)(uint)(iVar8 + (int)pHVar18) * 4);
                            if (pHVar18 < local_138) {
                              puVar26 = puVar22;
                            }
                            *puVar26 = 0;
                            pHVar18 = (HuffmanTree *)((long)&pHVar18->codes + 1);
                            iVar23 = iVar23 + -1;
                            puVar22 = puVar22 + 1;
                            iVar16 = iVar16 + -1;
                          } while (iVar16 != 0);
                        }
                        else if (uVar14 == 0x11) {
                          uVar14 = local_178.buffer & 7;
                          local_178.buffer = local_178.buffer >> 3;
                          local_178.bp = local_178.bp + 3;
                          pHVar18 = (HuffmanTree *)(ulong)uVar19;
                          iVar23 = -uVar19;
                          puVar22 = (uint *)((long)&bitlen_00->codes + (long)pHVar18 * 4);
                          iVar16 = uVar14 + 3;
                          do {
                            if (local_140 <= pHVar18) {
                              uVar19 = -iVar23;
                              local_144 = 0xe;
                              goto LAB_0012658f;
                            }
                            puVar26 = (uint *)((long)&local_150->codes +
                                              (ulong)(uint)(iVar8 + (int)pHVar18) * 4);
                            if (pHVar18 < local_138) {
                              puVar26 = puVar22;
                            }
                            *puVar26 = 0;
                            pHVar18 = (HuffmanTree *)((long)&pHVar18->codes + 1);
                            iVar23 = iVar23 + -1;
                            puVar22 = puVar22 + 1;
                            iVar16 = iVar16 + -1;
                          } while (iVar16 != 0);
                        }
                        else {
                          if (uVar14 != 0x10) {
                            uVar14 = 0x10;
                            goto LAB_00125f28;
                          }
                          if (uVar19 == 0) {
                            uVar14 = 0x36;
                            goto LAB_00125f28;
                          }
                          uVar14 = local_178.buffer & 3;
                          local_178.buffer = local_178.buffer >> 2;
                          local_178.bp = local_178.bp + 2;
                          puVar22 = (uint *)((long)&local_150->codes +
                                            (ulong)((uVar19 - 0x102) + (int)local_130) * 4);
                          if (uVar19 < local_120) {
                            puVar22 = (uint *)((long)&bitlen_00->codes + (ulong)(uVar19 - 1) * 4);
                          }
                          uVar15 = *puVar22;
                          pHVar18 = (HuffmanTree *)(ulong)uVar19;
                          iVar23 = -uVar19;
                          puVar22 = (uint *)((long)&bitlen_00->codes + (long)pHVar18 * 4);
                          iVar16 = uVar14 + 3;
                          do {
                            if (local_140 <= pHVar18) {
                              uVar19 = -iVar23;
                              local_144 = 0xd;
                              goto LAB_0012658f;
                            }
                            puVar26 = (uint *)((long)&local_150->codes +
                                              (ulong)(uint)(iVar8 + (int)pHVar18) * 4);
                            if (pHVar18 < local_138) {
                              puVar26 = puVar22;
                            }
                            *puVar26 = uVar15;
                            pHVar18 = (HuffmanTree *)((long)&pHVar18->codes + 1);
                            iVar23 = iVar23 + -1;
                            puVar22 = puVar22 + 1;
                            iVar16 = iVar16 + -1;
                          } while (iVar16 != 0);
                        }
                        uVar19 = -iVar23;
                      }
LAB_0012658f:
                      uVar14 = 0x32;
                      if (local_178.bitsize < local_178.bp) goto LAB_00125f28;
                      uVar25 = local_178.bp;
                    } while (uVar19 < (uint)local_140);
                    uVar14 = local_144;
                    if (local_144 == 0) {
                      if (*(int *)&bitlen_00[0x19].table_len == 0) {
                        uVar14 = 0x40;
                      }
                      else {
                        uVar14 = HuffmanTree_makeFromLengths
                                           ((HuffmanTree *)local_b8,(uint *)bitlen_00,0x120,0xf);
                        if (uVar14 == 0) {
                          uVar14 = HuffmanTree_makeFromLengths
                                             ((HuffmanTree *)local_e8,(uint *)local_150,0x20,0xf);
                        }
                      }
                    }
                  }
                }
                else {
                  bitlen_00 = (HuffmanTree *)0x0;
                  local_150 = (HuffmanTree *)0x0;
                }
              }
LAB_00125f28:
              free(bitlen);
              free(bitlen_00);
              free(local_150);
              HuffmanTree_cleanup((HuffmanTree *)local_88);
            }
          }
LAB_00125f4f:
          if (uVar14 == 0) {
            local_150 = (HuffmanTree *)local_a0._0_8_;
            local_140 = (HuffmanTree *)local_a0._8_8_;
            local_138 = (HuffmanTree *)local_d0._0_8_;
            do {
              uVar21 = local_178.bp >> 3;
              if (uVar21 + 3 < local_178.size) {
                local_178.buffer = *(uint *)(local_178.data + uVar21);
              }
              else {
                local_178.buffer = 0;
                if (uVar21 < local_178.size) {
                  local_178.buffer = (uint)local_178.data[uVar21];
                }
                if (uVar21 + 1 < local_178.size) {
                  local_178.buffer = local_178.buffer | (uint)local_178.data[uVar21 + 1] << 8;
                }
                if (uVar21 + 2 < local_178.size) {
                  local_178.buffer = local_178.buffer | (uint)local_178.data[uVar21 + 2] << 0x10;
                }
              }
              local_178.buffer = local_178.buffer >> ((byte)local_178.bp & 7);
              uVar14 = huffmanDecodeSymbol(&local_178,local_150);
              if (uVar14 < 0x100) {
                uVar19 = ucvector_resize(out,out->size + 1);
                if (uVar19 == 0) {
                  uVar14 = 0x53;
                  goto LAB_00125f54;
                }
                out->data[out->size - 1] = (uchar)uVar14;
              }
              else {
                if ((uVar14 == 0x100) || (0x11d < uVar14)) {
                  uVar14 = (uint)(uVar14 != 0x100) << 4;
                  goto LAB_00125f54;
                }
                uVar25 = (ulong)(uVar14 - 0x101);
                uVar21 = (ulong)LENGTHBASE[uVar25];
                if (0xffffffffffffffeb < uVar25 - 0x1c) {
                  local_178.bp = local_178.bp + LENGTHEXTRA[uVar25];
                  uVar21 = uVar21 + (~(-1 << ((byte)LENGTHEXTRA[uVar25] & 0x1f)) & local_178.buffer)
                  ;
                }
                uVar25 = local_178.bp >> 3;
                bVar17 = (byte)local_178.bp;
                if (uVar25 + 4 < local_178.size) {
                  local_178.buffer =
                       ((uint)local_178.data[uVar25 + 4] << 0x18) << (8 - (bVar17 & 7) & 0x1f) |
                       *(uint *)(local_178.data + uVar25) >> (bVar17 & 7);
                }
                else {
                  local_178.buffer = 0;
                  if (uVar25 < local_178.size) {
                    local_178.buffer = (uint)local_178.data[uVar25];
                  }
                  if (uVar25 + 1 < local_178.size) {
                    local_178.buffer = local_178.buffer | (uint)local_178.data[uVar25 + 1] << 8;
                  }
                  if (uVar25 + 2 < local_178.size) {
                    local_178.buffer = local_178.buffer | (uint)local_178.data[uVar25 + 2] << 0x10;
                  }
                  if (uVar25 + 3 < local_178.size) {
                    local_178.buffer = local_178.buffer | (uint)local_178.data[uVar25 + 3] << 0x18;
                  }
                  local_178.buffer = local_178.buffer >> (bVar17 & 7);
                }
                uVar14 = huffmanDecodeSymbol(&local_178,local_138);
                if (0x1d < uVar14) {
                  uVar14 = (uint)(uVar14 < 0x20) * 2 + 0x10;
                  goto LAB_00125f54;
                }
                uVar19 = DISTANCEBASE[uVar14];
                if (3 < uVar14) {
                  bVar17 = (byte)DISTANCEEXTRA[uVar14];
                  uVar15 = ~(-1 << (bVar17 & 0x1f)) & local_178.buffer;
                  local_178.buffer = local_178.buffer >> (bVar17 & 0x1f);
                  local_178.bp = local_178.bp + DISTANCEEXTRA[uVar14];
                  uVar19 = uVar19 + uVar15;
                }
                uVar25 = out->size;
                uVar20 = (ulong)uVar19;
                lVar24 = uVar25 - uVar20;
                if (uVar25 < uVar20) {
                  uVar14 = 0x34;
                  goto LAB_00125f54;
                }
                uVar14 = ucvector_resize(out,uVar25 + uVar21);
                if (uVar14 == 0) {
                  uVar14 = 0x53;
                  goto LAB_00125f54;
                }
                lVar27 = uVar21 - uVar20;
                if (uVar21 < uVar20 || lVar27 == 0) {
                  if (uVar21 != 0) {
                    memcpy(out->data + uVar25,out->data + lVar24,uVar21);
                  }
                }
                else {
                  if (uVar20 != 0) {
                    memcpy(out->data + uVar25,out->data + lVar24,uVar20);
                  }
                  lVar28 = uVar25 + uVar20;
                  do {
                    puVar1 = out->data + lVar24;
                    lVar24 = lVar24 + 1;
                    out->data[lVar28] = *puVar1;
                    lVar28 = lVar28 + 1;
                    lVar27 = lVar27 + -1;
                  } while (lVar27 != 0);
                }
              }
            } while (local_178.bp <= local_178.bitsize);
            uVar14 = 0x33;
          }
        }
LAB_00125f54:
        HuffmanTree_cleanup((HuffmanTree *)local_b8);
        HuffmanTree_cleanup((HuffmanTree *)local_e8);
      }
      uVar19 = local_11c & 1;
    } while (uVar14 == 0);
  }
  return uVar14;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
  const unsigned char* in, size_t insize,
  const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if (error) return error;

  while (!BFINAL) {
    unsigned BTYPE;
    if (!ensureBits9(&reader, 3)) return 52; /*error, bit pointer will jump past memory*/
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if (BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if (BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE); /*compression, BTYPE 01 or 10*/

    if (error) return error;
  }

  return error;
}